

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3TriggerColmask
              (Parse *pParse,Trigger *pTrigger,ExprList *pChanges,int isNew,int tr_tm,Table *pTab,
              int orconf)

{
  char cVar1;
  int iVar2;
  TriggerPrg *pTVar3;
  TriggerPrg *pPrg;
  Trigger *p;
  u32 mask;
  int op;
  Table *pTab_local;
  int tr_tm_local;
  int isNew_local;
  ExprList *pChanges_local;
  Trigger *pTrigger_local;
  Parse *pParse_local;
  
  cVar1 = -0x80;
  if (pChanges != (ExprList *)0x0) {
    cVar1 = -0x7f;
  }
  p._0_4_ = 0;
  pPrg = (TriggerPrg *)pTrigger;
  if (pTab->eTabType == '\x02') {
    pParse_local._4_4_ = 0xffffffff;
  }
  else {
    for (; pPrg != (TriggerPrg *)0x0; pPrg = *(TriggerPrg **)&pPrg[1].orconf) {
      if (((*(char *)&pPrg->pProgram == cVar1) &&
          ((tr_tm & (uint)*(byte *)((long)&pPrg->pProgram + 1)) != 0)) &&
         (iVar2 = checkColumnOverlap(*(IdList **)(pPrg->aColmask + 1),pChanges), iVar2 != 0)) {
        if (*(char *)((long)&pPrg->pProgram + 2) == '\0') {
          pTVar3 = getRowTrigger(pParse,(Trigger *)pPrg,pTab,orconf);
          if (pTVar3 != (TriggerPrg *)0x0) {
            p._0_4_ = pTVar3->aColmask[isNew] | (uint)p;
          }
        }
        else {
          p._0_4_ = 0xffffffff;
        }
      }
    }
    pParse_local._4_4_ = (uint)p;
  }
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3TriggerColmask(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int isNew,           /* 1 for new.* ref mask, 0 for old.* ref mask */
  int tr_tm,           /* Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int orconf           /* Default ON CONFLICT policy for trigger steps */
){
  const int op = pChanges ? TK_UPDATE : TK_DELETE;
  u32 mask = 0;
  Trigger *p;

  assert( isNew==1 || isNew==0 );
  if( IsView(pTab) ){
    return 0xffffffff;
  }
  for(p=pTrigger; p; p=p->pNext){
    if( p->op==op
     && (tr_tm&p->tr_tm)
     && checkColumnOverlap(p->pColumns,pChanges)
    ){
      if( p->bReturning ){
        mask = 0xffffffff;
      }else{
        TriggerPrg *pPrg;
        pPrg = getRowTrigger(pParse, p, pTab, orconf);
        if( pPrg ){
          mask |= pPrg->aColmask[isNew];
        }
      }
    }
  }

  return mask;
}